

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O1

void __thiscall leveldb::MemEnvTest_ReadWrite_Test::TestBody(MemEnvTest_ReadWrite_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *pEVar2;
  size_type sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  AssertHelperData *pAVar7;
  undefined8 *puVar8;
  AssertHelper *this_00;
  string *this_01;
  _Alloc_hider _Var9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *expected_predicate_value;
  char *pcVar10;
  AssertionResult gtest_ar_15;
  RandomAccessFile *rand_file;
  AssertionResult gtest_ar;
  Slice result;
  SequentialFile *seq_file;
  WritableFile *writable_file;
  char scratch [100];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  string local_f0;
  AssertHelper local_d0;
  char *local_c8;
  AssertHelperData *local_c0;
  long *local_b8;
  long *local_b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  undefined8 *local_a0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [96];
  AssertHelper local_38;
  
  pcVar10 = "";
  local_c8 = "";
  local_c0 = (AssertHelperData *)0x0;
  pEVar2 = (this->super_MemEnvTest).env_;
  local_a8._M_head_impl = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/dir","");
  (*pEVar2->_vptr_Env[10])(local_108,pEVar2,(string *)&local_a8);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f0,
             (char *)&local_b0,(Status *)"env_->CreateDir(\"/dir\")");
  if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
    operator_delete__((void *)local_108._0_8_);
  }
  if (local_a8._M_head_impl != local_98) {
    operator_delete(local_a8._M_head_impl);
  }
  sVar3 = local_f0._M_string_length;
  if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      pcVar10 = *(char **)local_f0._M_string_length;
    }
    iVar6 = 0x65;
  }
  else {
    if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_f0._M_string_length !=
          (undefined8 *)(local_f0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_f0._M_string_length);
      }
      operator_delete((void *)sVar3);
    }
    pEVar2 = (this->super_MemEnvTest).env_;
    local_a8._M_head_impl = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/dir/f","");
    (*pEVar2->_vptr_Env[4])(local_108,pEVar2,(string *)&local_a8,&local_b0);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f0,
               (char *)&local_b8,(Status *)"env_->NewWritableFile(\"/dir/f\", &writable_file)");
    if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
      operator_delete__((void *)local_108._0_8_);
    }
    if (local_a8._M_head_impl != local_98) {
      operator_delete(local_a8._M_head_impl);
    }
    if (local_f0._M_dataplus._M_p._0_1_ != '\0') {
      if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_f0._M_string_length !=
            (undefined8 *)(local_f0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_f0._M_string_length);
        }
        operator_delete((void *)local_f0._M_string_length);
      }
      local_f0._M_dataplus._M_p = "hello ";
      local_f0._M_string_length = 6;
      (**(code **)(*local_b0 + 0x10))(local_108);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_a8,
                 (char *)&local_b8,(Status *)"writable_file->Append(\"hello \")");
      if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
        operator_delete__((void *)local_108._0_8_);
      }
      puVar8 = local_a0;
      if (local_a8._M_head_impl._0_1_ == (string)0x0) {
        testing::Message::Message((Message *)&local_f0);
        if (local_a0 == (undefined8 *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (char *)*local_a0;
        }
        iVar6 = 0x68;
      }
      else {
        if (local_a0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_a0 != local_a0 + 2) {
            operator_delete((undefined8 *)*local_a0);
          }
          operator_delete(puVar8);
        }
        local_f0._M_dataplus._M_p = "world";
        local_f0._M_string_length = 5;
        (**(code **)(*local_b0 + 0x10))(local_108);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_a8,
                   (char *)&local_b8,(Status *)"writable_file->Append(\"world\")");
        if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
          operator_delete__((void *)local_108._0_8_);
        }
        if (local_a8._M_head_impl._0_1_ != (string)0x0) {
          if (local_a0 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_a0 != local_a0 + 2) {
              operator_delete((undefined8 *)*local_a0);
            }
            operator_delete(local_a0);
          }
          if (local_b0 != (long *)0x0) {
            (**(code **)(*local_b0 + 8))();
          }
          pEVar2 = (this->super_MemEnvTest).env_;
          local_a8._M_head_impl = local_98;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/dir/f","");
          (*pEVar2->_vptr_Env[2])(local_108,pEVar2,(string *)&local_a8,&local_b8);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f0,local_f8
                     ,(Status *)"env_->NewSequentialFile(\"/dir/f\", &seq_file)");
          if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
            operator_delete__((void *)local_108._0_8_);
          }
          if (local_a8._M_head_impl != local_98) {
            operator_delete(local_a8._M_head_impl);
          }
          sVar3 = local_f0._M_string_length;
          if (local_f0._M_dataplus._M_p._0_1_ != '\0') {
            if ((undefined8 *)local_f0._M_string_length != (undefined8 *)0x0) {
              if (*(undefined8 **)local_f0._M_string_length !=
                  (undefined8 *)(local_f0._M_string_length + 0x10)) {
                operator_delete(*(undefined8 **)local_f0._M_string_length);
              }
              operator_delete((void *)sVar3);
            }
            (**(code **)(*local_b8 + 0x10))(local_108,local_b8,5,&local_c8,&local_a8);
            testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                      ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f0,
                       local_f8,(Status *)"seq_file->Read(5, &result, scratch)");
            if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
              operator_delete__((void *)local_108._0_8_);
            }
            if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
              testing::Message::Message((Message *)local_108);
              if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                pcVar10 = "";
              }
              else {
                pcVar10 = *(char **)local_f0._M_string_length;
              }
              this_00 = (AssertHelper *)local_f8;
              iVar6 = 0x6e;
            }
            else {
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
              local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
              pAVar7 = (AssertHelperData *)&DAT_00000005;
              if (local_c0 < (AssertHelperData *)&DAT_00000005) {
                pAVar7 = local_c0;
              }
              uVar5 = 0xffffffff;
              if (local_c0 >= (AssertHelperData *)&DAT_00000005) {
                uVar5 = (uint)((AssertHelperData *)&DAT_00000005 < local_c0);
              }
              uVar4 = memcmp(local_c8,"hello",(size_t)pAVar7);
              local_f8._0_4_ = uVar5;
              if (uVar4 != 0) {
                local_f8._0_4_ = uVar4;
              }
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_f0,"0","result.compare(\"hello\")",(int *)local_108,
                         (int *)local_f8);
              if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                testing::Message::Message((Message *)local_108);
                if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = *(char **)local_f0._M_string_length;
                }
                this_00 = (AssertHelper *)local_f8;
                iVar6 = 0x6f;
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
                (**(code **)(*local_b8 + 0x18))(local_108,local_b8,1);
                testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f0,
                           local_f8,(Status *)"seq_file->Skip(1)");
                if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
                  operator_delete__((void *)local_108._0_8_);
                }
                if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                  testing::Message::Message((Message *)local_108);
                  if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                    pcVar10 = "";
                  }
                  else {
                    pcVar10 = *(char **)local_f0._M_string_length;
                  }
                  this_00 = (AssertHelper *)local_f8;
                  iVar6 = 0x70;
                }
                else {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
                  (**(code **)(*local_b8 + 0x10))(local_108,local_b8,1000,&local_c8,&local_a8);
                  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                  operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f0,
                             local_f8,(Status *)"seq_file->Read(1000, &result, scratch)");
                  if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
                    operator_delete__((void *)local_108._0_8_);
                  }
                  if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                    testing::Message::Message((Message *)local_108);
                    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                      pcVar10 = "";
                    }
                    else {
                      pcVar10 = *(char **)local_f0._M_string_length;
                    }
                    this_00 = (AssertHelper *)local_f8;
                    iVar6 = 0x71;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
                    local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
                    pAVar7 = (AssertHelperData *)&DAT_00000005;
                    if (local_c0 < (AssertHelperData *)&DAT_00000005) {
                      pAVar7 = local_c0;
                    }
                    uVar5 = 0xffffffff;
                    if (local_c0 >= (AssertHelperData *)&DAT_00000005) {
                      uVar5 = (uint)((AssertHelperData *)&DAT_00000005 < local_c0);
                    }
                    uVar4 = memcmp(local_c8,"world",(size_t)pAVar7);
                    local_f8._0_4_ = uVar5;
                    if (uVar4 != 0) {
                      local_f8._0_4_ = uVar4;
                    }
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_f0,"0","result.compare(\"world\")",
                               (int *)local_108,(int *)local_f8);
                    if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                      testing::Message::Message((Message *)local_108);
                      if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                        pcVar10 = "";
                      }
                      else {
                        pcVar10 = *(char **)local_f0._M_string_length;
                      }
                      this_00 = (AssertHelper *)local_f8;
                      iVar6 = 0x72;
                    }
                    else {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
                      (**(code **)(*local_b8 + 0x10))(local_108,local_b8,1000,&local_c8,&local_a8);
                      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                      operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                                 &local_f0,local_f8,
                                 (Status *)"seq_file->Read(1000, &result, scratch)");
                      if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
                        operator_delete__((void *)local_108._0_8_);
                      }
                      if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                        testing::Message::Message((Message *)local_108);
                        if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                          pcVar10 = "";
                        }
                        else {
                          pcVar10 = *(char **)local_f0._M_string_length;
                        }
                        this_00 = (AssertHelper *)local_f8;
                        iVar6 = 0x74;
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
                        local_f8._0_4_ = 0;
                        local_108._0_8_ = local_c0;
                        testing::internal::CmpHelperEQ<int,unsigned_long>
                                  ((internal *)&local_f0,"0","result.size()",(int *)local_f8,
                                   (unsigned_long *)local_108);
                        if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                          testing::Message::Message((Message *)local_108);
                          if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                            pcVar10 = "";
                          }
                          else {
                            pcVar10 = *(char **)local_f0._M_string_length;
                          }
                          this_00 = (AssertHelper *)local_f8;
                          iVar6 = 0x75;
                        }
                        else {
                          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0);
                          (**(code **)(*local_b8 + 0x18))(local_108,local_b8,100);
                          testing::internal::
                          PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                                     &local_f0,local_f8,(Status *)"seq_file->Skip(100)");
                          if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
                            operator_delete__((void *)local_108._0_8_);
                          }
                          if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                            testing::Message::Message((Message *)local_108);
                            if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                              pcVar10 = "";
                            }
                            else {
                              pcVar10 = *(char **)local_f0._M_string_length;
                            }
                            this_00 = (AssertHelper *)local_f8;
                            iVar6 = 0x76;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_f0)
                            ;
                            (**(code **)(*local_b8 + 0x10))
                                      (local_108,local_b8,1000,&local_c8,&local_a8);
                            testing::internal::
                            PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                                      ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                                       &local_f0,local_f8,
                                       (Status *)"seq_file->Read(1000, &result, scratch)");
                            if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
                              operator_delete__((void *)local_108._0_8_);
                            }
                            if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                              testing::Message::Message((Message *)local_108);
                              if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                                pcVar10 = "";
                              }
                              else {
                                pcVar10 = *(char **)local_f0._M_string_length;
                              }
                              this_00 = (AssertHelper *)local_f8;
                              iVar6 = 0x77;
                            }
                            else {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_f0);
                              local_f8._0_4_ = 0;
                              local_108._0_8_ = local_c0;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)&local_f0,"0","result.size()",(int *)local_f8,
                                         (unsigned_long *)local_108);
                              if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                                testing::Message::Message((Message *)local_108);
                                if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
                                  pcVar10 = "";
                                }
                                else {
                                  pcVar10 = *(char **)local_f0._M_string_length;
                                }
                                this_00 = (AssertHelper *)local_f8;
                                iVar6 = 0x78;
                              }
                              else {
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)&local_f0);
                                if (local_b8 != (long *)0x0) {
                                  (**(code **)(*local_b8 + 8))();
                                }
                                pEVar2 = (this->super_MemEnvTest).env_;
                                paVar1 = &local_f0.field_2;
                                local_f0._M_dataplus._M_p = (pointer)paVar1;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_f0,"/dir/f","");
                                (*pEVar2->_vptr_Env[3])(&local_d0,pEVar2,&local_f0,local_f8);
                                testing::internal::
                                PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                            *)local_108,(char *)&local_38,
                                           (Status *)
                                           "env_->NewRandomAccessFile(\"/dir/f\", &rand_file)");
                                if ((void *)CONCAT44(local_d0.data_._4_4_,(uint)local_d0.data_) !=
                                    (void *)0x0) {
                                  operator_delete__((void *)CONCAT44(local_d0.data_._4_4_,
                                                                     (uint)local_d0.data_));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_f0._M_dataplus._M_p != paVar1) {
                                  operator_delete(local_f0._M_dataplus._M_p);
                                }
                                if (local_108[0] ==
                                    (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0)
                                {
                                  testing::Message::Message((Message *)&local_f0);
                                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_108._8_8_ ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar10 = "";
                                  }
                                  else {
                                    pcVar10 = ((_Alloc_hider *)local_108._8_8_)->_M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_d0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                             ,0x7c,pcVar10);
                                  testing::internal::AssertHelper::operator=
                                            (&local_d0,(Message *)&local_f0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_d0);
                                  _Var9._M_p = local_f0._M_dataplus._M_p;
LAB_0010dd42:
                                  this_01 = (string *)local_108;
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)_Var9._M_p !=
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)0x0) {
                                    (**(code **)(*(size_type *)_Var9._M_p + 8))();
                                    this_01 = (string *)local_108;
                                  }
                                  goto LAB_0010dce1;
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_108);
                                (**(code **)(*(long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) + 0x10
                                            ))(local_108,
                                               (long *)CONCAT44(local_f8._4_4_,local_f8._0_4_),6,5,
                                               &local_c8,&local_a8);
                                testing::internal::
                                PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                            *)&local_f0,(char *)&local_d0,
                                           (Status *)"rand_file->Read(6, 5, &result, scratch)");
                                if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0)
                                {
                                  operator_delete__((void *)local_108._0_8_);
                                }
                                if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                                  testing::Message::Message((Message *)local_108);
                                  if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0)
                                  {
                                    pcVar10 = "";
                                  }
                                  else {
                                    pcVar10 = *(char **)local_f0._M_string_length;
                                  }
                                  this_00 = &local_d0;
                                  iVar6 = 0x7d;
                                }
                                else {
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)&local_f0);
                                  local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
                                  pAVar7 = (AssertHelperData *)&DAT_00000005;
                                  if (local_c0 < (AssertHelperData *)&DAT_00000005) {
                                    pAVar7 = local_c0;
                                  }
                                  uVar5 = 0xffffffff;
                                  if (local_c0 >= (AssertHelperData *)&DAT_00000005) {
                                    uVar5 = (uint)((AssertHelperData *)&DAT_00000005 < local_c0);
                                  }
                                  uVar4 = memcmp(local_c8,"world",(size_t)pAVar7);
                                  local_d0.data_._0_4_ = uVar5;
                                  if (uVar4 != 0) {
                                    local_d0.data_._0_4_ = uVar4;
                                  }
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)&local_f0,"0","result.compare(\"world\")",
                                             (int *)local_108,(int *)&local_d0);
                                  if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                                    testing::Message::Message((Message *)local_108);
                                    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0
                                       ) {
                                      pcVar10 = "";
                                    }
                                    else {
                                      pcVar10 = *(char **)local_f0._M_string_length;
                                    }
                                    this_00 = &local_d0;
                                    iVar6 = 0x7e;
                                  }
                                  else {
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)&local_f0);
                                    (**(code **)(*(long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) +
                                                0x10))(local_108,
                                                       (long *)CONCAT44(local_f8._4_4_,
                                                                        local_f8._0_4_),0,5,
                                                       &local_c8,&local_a8);
                                    testing::internal::
                                    PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                    operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                *)&local_f0,(char *)&local_d0,
                                               (Status *)"rand_file->Read(0, 5, &result, scratch)");
                                    if ((AssertHelperData *)local_108._0_8_ !=
                                        (AssertHelperData *)0x0) {
                                      operator_delete__((void *)local_108._0_8_);
                                    }
                                    if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                                      testing::Message::Message((Message *)local_108);
                                      if ((undefined8 *)local_f0._M_string_length ==
                                          (undefined8 *)0x0) {
                                        pcVar10 = "";
                                      }
                                      else {
                                        pcVar10 = *(char **)local_f0._M_string_length;
                                      }
                                      this_00 = &local_d0;
                                      iVar6 = 0x7f;
                                    }
                                    else {
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)&local_f0);
                                      local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
                                      pAVar7 = (AssertHelperData *)&DAT_00000005;
                                      if (local_c0 < (AssertHelperData *)&DAT_00000005) {
                                        pAVar7 = local_c0;
                                      }
                                      uVar5 = 0xffffffff;
                                      if (local_c0 >= (AssertHelperData *)&DAT_00000005) {
                                        uVar5 = (uint)((AssertHelperData *)&DAT_00000005 < local_c0)
                                        ;
                                      }
                                      uVar4 = memcmp(local_c8,"hello",(size_t)pAVar7);
                                      local_d0.data_._0_4_ = uVar5;
                                      if (uVar4 != 0) {
                                        local_d0.data_._0_4_ = uVar4;
                                      }
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)&local_f0,"0",
                                                 "result.compare(\"hello\")",(int *)local_108,
                                                 (int *)&local_d0);
                                      if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                                        testing::Message::Message((Message *)local_108);
                                        if ((undefined8 *)local_f0._M_string_length ==
                                            (undefined8 *)0x0) {
                                          pcVar10 = "";
                                        }
                                        else {
                                          pcVar10 = *(char **)local_f0._M_string_length;
                                        }
                                        this_00 = &local_d0;
                                        iVar6 = 0x80;
                                      }
                                      else {
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)&local_f0);
                                        (**(code **)(*(long *)CONCAT44(local_f8._4_4_,local_f8._0_4_
                                                                      ) + 0x10))
                                                  (local_108,
                                                   (long *)CONCAT44(local_f8._4_4_,local_f8._0_4_),
                                                   10,100,&local_c8,&local_a8);
                                        testing::internal::
                                        PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
                                        operator()((
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  *)&local_f0,(char *)&local_d0,
                                                  (Status *)
                                                  "rand_file->Read(10, 100, &result, scratch)");
                                        if ((AssertHelperData *)local_108._0_8_ !=
                                            (AssertHelperData *)0x0) {
                                          operator_delete__((void *)local_108._0_8_);
                                        }
                                        if (local_f0._M_dataplus._M_p._0_1_ == '\0') {
                                          testing::Message::Message((Message *)local_108);
                                          if ((undefined8 *)local_f0._M_string_length ==
                                              (undefined8 *)0x0) {
                                            pcVar10 = "";
                                          }
                                          else {
                                            pcVar10 = *(char **)local_f0._M_string_length;
                                          }
                                          this_00 = &local_d0;
                                          iVar6 = 0x81;
                                        }
                                        else {
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)&local_f0);
                                          pAVar7 = local_c0;
                                          local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
                                          uVar5 = memcmp(local_c8,"d",
                                                         (ulong)(local_c0 != (AssertHelperData *)0x0
                                                                ));
                                          local_d0.data_._0_4_ =
                                               -(uint)(pAVar7 == (AssertHelperData *)0x0) |
                                               (uint)((AssertHelperData *)0x1 < pAVar7);
                                          if (uVar5 != 0) {
                                            local_d0.data_._0_4_ = uVar5;
                                          }
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)&local_f0,"0",
                                                     "result.compare(\"d\")",(int *)local_108,
                                                     (int *)&local_d0);
                                          if (local_f0._M_dataplus._M_p._0_1_ != '\0') {
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)&local_f0);
                                            expected_predicate_value = &local_a8;
                                            (**(code **)(*(long *)CONCAT44(local_f8._4_4_,
                                                                           local_f8._0_4_) + 0x10))
                                                      (&local_f0,
                                                       (long *)CONCAT44(local_f8._4_4_,
                                                                        local_f8._0_4_),1000,5,
                                                       &local_c8);
                                            local_108[0] = (
                                                  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                  )((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_f0._M_dataplus._M_p !=
                                                  (
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)0x0);
                                            local_108._8_8_ =
                                                 (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0;
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_f0._M_dataplus._M_p !=
                                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)0x0) {
                                              operator_delete__(local_f0._M_dataplus._M_p);
                                            }
                                            if (local_108[0] !=
                                                (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>
                                                 )0x0) {
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_108);
                                              if ((long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) ==
                                                  (long *)0x0) {
                                                return;
                                              }
                                              (**(code **)(*(long *)CONCAT44(local_f8._4_4_,
                                                                             local_f8._0_4_) + 8))()
                                              ;
                                              return;
                                            }
                                            testing::Message::Message((Message *)&local_d0);
                                            testing::internal::
                                            GetBoolAssertionFailureMessage_abi_cxx11_
                                                      (&local_f0,(internal *)local_108,
                                                       (AssertionResult *)
                                                                                                              
                                                  "!rand_file->Read(1000, 5, &result, scratch).ok()"
                                                  ,"false","true",(char *)expected_predicate_value);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_38,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                                                  ,0x85,local_f0._M_dataplus._M_p);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_38,(Message *)&local_d0);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_38);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_f0._M_dataplus._M_p != paVar1) {
                                              operator_delete(local_f0._M_dataplus._M_p);
                                            }
                                            _Var9._M_p = (pointer)CONCAT44(local_d0.data_._4_4_,
                                                                           (uint)local_d0.data_);
                                            goto LAB_0010dd42;
                                          }
                                          testing::Message::Message((Message *)local_108);
                                          if ((undefined8 *)local_f0._M_string_length ==
                                              (undefined8 *)0x0) {
                                            pcVar10 = "";
                                          }
                                          else {
                                            pcVar10 = *(char **)local_f0._M_string_length;
                                          }
                                          this_00 = &local_d0;
                                          iVar6 = 0x82;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            testing::internal::AssertHelper::AssertHelper
                      (this_00,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,iVar6,pcVar10);
            testing::internal::AssertHelper::operator=(this_00,(Message *)local_108);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            if ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_108._0_8_ + 8))();
            }
            this_01 = &local_f0;
LAB_0010dce1:
            testing::AssertionResult::~AssertionResult((AssertionResult *)this_01);
            return;
          }
          testing::Message::Message((Message *)&local_a8);
          if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)local_f0._M_string_length;
          }
          iVar6 = 0x6d;
          goto LAB_0010d925;
        }
        testing::Message::Message((Message *)&local_f0);
        if (local_a0 == (undefined8 *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (char *)*local_a0;
        }
        iVar6 = 0x69;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,iVar6,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
      puVar8 = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
        puVar8 = local_a0;
      }
      goto LAB_0010d955;
    }
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_f0._M_string_length;
    }
    iVar6 = 0x67;
  }
LAB_0010d925:
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
             ,iVar6,pcVar10);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
  puVar8 = (undefined8 *)local_f0._M_string_length;
  if (local_a8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    puVar8 = (undefined8 *)local_f0._M_string_length;
  }
LAB_0010d955:
  if (puVar8 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar8 != puVar8 + 2) {
      operator_delete((undefined8 *)*puVar8);
    }
    operator_delete(puVar8);
  }
  return;
}

Assistant:

TEST_F(MemEnvTest, ReadWrite) {
  WritableFile* writable_file;
  SequentialFile* seq_file;
  RandomAccessFile* rand_file;
  Slice result;
  char scratch[100];

  ASSERT_LEVELDB_OK(env_->CreateDir("/dir"));

  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(writable_file->Append("hello "));
  ASSERT_LEVELDB_OK(writable_file->Append("world"));
  delete writable_file;

  // Read sequentially.
  ASSERT_LEVELDB_OK(env_->NewSequentialFile("/dir/f", &seq_file));
  ASSERT_LEVELDB_OK(seq_file->Read(5, &result, scratch));  // Read "hello".
  ASSERT_EQ(0, result.compare("hello"));
  ASSERT_LEVELDB_OK(seq_file->Skip(1));
  ASSERT_LEVELDB_OK(seq_file->Read(1000, &result, scratch));  // Read "world".
  ASSERT_EQ(0, result.compare("world"));
  ASSERT_LEVELDB_OK(
      seq_file->Read(1000, &result, scratch));  // Try reading past EOF.
  ASSERT_EQ(0, result.size());
  ASSERT_LEVELDB_OK(seq_file->Skip(100));  // Try to skip past end of file.
  ASSERT_LEVELDB_OK(seq_file->Read(1000, &result, scratch));
  ASSERT_EQ(0, result.size());
  delete seq_file;

  // Random reads.
  ASSERT_LEVELDB_OK(env_->NewRandomAccessFile("/dir/f", &rand_file));
  ASSERT_LEVELDB_OK(rand_file->Read(6, 5, &result, scratch));  // Read "world".
  ASSERT_EQ(0, result.compare("world"));
  ASSERT_LEVELDB_OK(rand_file->Read(0, 5, &result, scratch));  // Read "hello".
  ASSERT_EQ(0, result.compare("hello"));
  ASSERT_LEVELDB_OK(rand_file->Read(10, 100, &result, scratch));  // Read "d".
  ASSERT_EQ(0, result.compare("d"));

  // Too high offset.
  ASSERT_TRUE(!rand_file->Read(1000, 5, &result, scratch).ok());
  delete rand_file;
}